

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall
re2::DFA::AnalyzeSearchHelper(DFA *this,SearchParams *params,StartInfo *info,uint flags)

{
  Workq *q;
  State *pSVar1;
  int local_128;
  State *s;
  int local_e0;
  int i;
  int firstbyte;
  MutexLock local_c8;
  MutexLock l;
  int fb;
  uint flags_local;
  StartInfo *info_local;
  SearchParams *params_local;
  DFA *this_local;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  l.mu_._4_4_ = flags;
  std::operator&(memory_order_acquire,__memory_order_mask);
  l.mu_._0_4_ = (info->firstbyte).super___atomic_base<int>._M_i;
  if ((int)l.mu_ == -1) {
    MutexLock::MutexLock(&local_c8,&this->mutex_);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    l.mu_._0_4_ = (info->firstbyte).super___atomic_base<int>._M_i;
    if ((int)l.mu_ == -1) {
      Workq::clear(this->q0_);
      q = this->q0_;
      if ((params->anchored & 1U) == 0) {
        local_128 = Prog::start_unanchored(this->prog_);
      }
      else {
        local_128 = Prog::start(this->prog_);
      }
      AddToQueue(this,q,local_128,l.mu_._4_4_);
      pSVar1 = WorkqToCachedState(this,this->q0_,l.mu_._4_4_);
      info->start = pSVar1;
      if (info->start == (State *)0x0) {
        this_local._7_1_ = false;
      }
      else if (info->start == (State *)0x1) {
        std::operator&(memory_order_release,__memory_order_mask);
        (info->firstbyte).super___atomic_base<int>._M_i = -3;
        this_local._7_1_ = true;
      }
      else if (info->start == (State *)0x2) {
        std::operator&(memory_order_release,__memory_order_mask);
        (info->firstbyte).super___atomic_base<int>._M_i = -3;
        this_local._7_1_ = true;
      }
      else {
        local_e0 = -3;
        for (s._4_4_ = 0; s._4_4_ < 0x100; s._4_4_ = s._4_4_ + 1) {
          pSVar1 = RunStateOnByte(this,info->start,s._4_4_);
          if (pSVar1 == (State *)0x0) {
            std::operator&(memory_order_release,__memory_order_mask);
            (info->firstbyte).super___atomic_base<int>._M_i = local_e0;
            this_local._7_1_ = false;
            goto LAB_001575d1;
          }
          if (pSVar1 != info->start) {
            if (local_e0 != -3) {
              local_e0 = -2;
              break;
            }
            local_e0 = s._4_4_;
          }
        }
        std::operator&(memory_order_release,__memory_order_mask);
        (info->firstbyte).super___atomic_base<int>._M_i = local_e0;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
LAB_001575d1:
    MutexLock::~MutexLock(&local_c8);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DFA::AnalyzeSearchHelper(SearchParams* params, StartInfo* info,
                              uint flags) {
  // Quick check.
  int fb = info->firstbyte.load(std::memory_order_acquire);
  if (fb != kFbUnknown)
    return true;

  MutexLock l(&mutex_);
  fb = info->firstbyte.load(std::memory_order_relaxed);
  if (fb != kFbUnknown)
    return true;

  q0_->clear();
  AddToQueue(q0_,
             params->anchored ? prog_->start() : prog_->start_unanchored(),
             flags);
  info->start = WorkqToCachedState(q0_, flags);
  if (info->start == NULL)
    return false;

  if (info->start == DeadState) {
    // Synchronize with "quick check" above.
    info->firstbyte.store(kFbNone, std::memory_order_release);
    return true;
  }

  if (info->start == FullMatchState) {
    // Synchronize with "quick check" above.
    info->firstbyte.store(kFbNone, std::memory_order_release);  // will be ignored
    return true;
  }

  // Compute info->firstbyte by running state on all
  // possible byte values, looking for a single one that
  // leads to a different state.
  int firstbyte = kFbNone;
  for (int i = 0; i < 256; i++) {
    State* s = RunStateOnByte(info->start, i);
    if (s == NULL) {
      // Synchronize with "quick check" above.
      info->firstbyte.store(firstbyte, std::memory_order_release);
      return false;
    }
    if (s == info->start)
      continue;
    // Goes to new state...
    if (firstbyte == kFbNone) {
      firstbyte = i;        // ... first one
    } else {
      firstbyte = kFbMany;  // ... too many
      break;
    }
  }

  // Synchronize with "quick check" above.
  info->firstbyte.store(firstbyte, std::memory_order_release);
  return true;
}